

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QList<QtDependency> * findFilesRecursively(Options *options,QString *fileName)

{
  bool bVar1;
  ulong uVar2;
  const_iterator options_00;
  QList<QtDependency> *in_RSI;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_> in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar3;
  QString *prefix;
  vector<QString,_std::allocator<QString>_> *__range1;
  QFileInfo rootPath;
  QFileInfo info_1;
  QFileInfo info;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QtDependency> deps;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_const_QString_&>
  *in_stack_fffffffffffffd68;
  QStringBuilder<const_QString_&,_QLatin1String> *in_stack_fffffffffffffd70;
  QList<QtDependency> *in_stack_fffffffffffffd78;
  QList<QtDependency> *in_stack_fffffffffffffd80;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
  in_stack_fffffffffffffd90;
  QFileInfo *info_00;
  Options *in_stack_fffffffffffffda8;
  undefined1 local_1c0 [24];
  undefined8 local_1a8;
  QLatin1StringView local_1a0;
  undefined1 local_158 [24];
  undefined8 local_140;
  QString *local_138;
  QString *local_130;
  QString *local_128;
  char16_t local_120;
  undefined2 local_112;
  QString *local_f8;
  char16_t local_f0;
  undefined2 local_e2;
  QString *local_b0;
  char16_t local_a8;
  undefined2 local_9a;
  undefined1 local_98 [24];
  QString *local_80;
  QString *local_78;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_> local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  QString *local_50;
  char16_t local_48;
  QString *local_40;
  char16_t local_38;
  QString *local_30;
  char16_t local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 0xaaaaaaaaaaaaaaaa;
  local_60 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  info_00 = (QFileInfo *)in_RDI._M_current;
  QList<QtDependency>::QList((QList<QtDependency> *)0x11dcf2);
  local_70._M_current = (QString *)0xaaaaaaaaaaaaaaaa;
  local_70._M_current =
       (QString *)
       std::vector<QString,_std::allocator<QString>_>::begin
                 ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffd70);
  local_78 = (QString *)0xaaaaaaaaaaaaaaaa;
  local_78 = (QString *)
             std::vector<QString,_std::allocator<QString>_>::end
                       ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffd70);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                             *)in_stack_fffffffffffffd70,
                            (__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                             *)in_stack_fffffffffffffd68), bVar1) {
    in_stack_fffffffffffffd90._M_current = (QString *)0xaaaaaaaaaaaaaaaa;
    __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
    operator*(&local_70);
    local_9a = 0x2f;
    local_80 = in_stack_fffffffffffffd90._M_current;
    QVar3 = operator+((QString *)in_stack_fffffffffffffd78,(char16_t *)in_stack_fffffffffffffd70);
    local_b0 = QVar3.a;
    local_a8 = QVar3.b;
    local_30 = local_b0;
    local_28 = local_a8;
    operator+((QStringBuilder<const_QString_&,_char16_t> *)in_stack_fffffffffffffd70,
              (QString *)in_stack_fffffffffffffd68);
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
               in_stack_fffffffffffffd68);
    QFileInfo::QFileInfo((QFileInfo *)&local_80,(QString *)local_98);
    QString::~QString((QString *)0x11de44);
    uVar2 = QFileInfo::exists();
    if ((uVar2 & 1) == 0) {
LAB_0011dfd4:
      bVar1 = false;
    }
    else {
      uVar2 = QFileInfo::isDir();
      if ((uVar2 & 1) != 0) {
        local_e2 = 0x2f;
        QVar3 = operator+((QString *)in_stack_fffffffffffffd78,(char16_t *)in_stack_fffffffffffffd70
                         );
        local_f8 = QVar3.a;
        local_f0 = QVar3.b;
        local_40 = local_f8;
        local_38 = local_f0;
        QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<const_QString_&,_char16_t> *)in_stack_fffffffffffffd68);
        findFilesRecursively(in_stack_fffffffffffffda8,info_00,in_RDI._M_current);
        QList<QtDependency>::append(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        QList<QtDependency>::~QList((QList<QtDependency> *)0x11df1f);
        QString::~QString((QString *)0x11df2c);
        goto LAB_0011dfd4;
      }
      local_112 = 0x2f;
      in_stack_fffffffffffffd80 = in_RSI;
      QVar3 = operator+((QString *)in_stack_fffffffffffffd78,(char16_t *)in_stack_fffffffffffffd70);
      local_128 = QVar3.a;
      local_120 = QVar3.b;
      local_50 = local_128;
      local_48 = local_120;
      QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<const_QString_&,_char16_t> *)in_stack_fffffffffffffd68);
      findFilesRecursively(in_stack_fffffffffffffda8,info_00,in_RDI._M_current);
      QString::~QString((QString *)0x11dfc8);
      bVar1 = true;
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_80);
    if (bVar1) goto LAB_0011e26f;
    __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
    operator++(&local_70);
  }
  std::vector<QString,_std::allocator<QString>_>::begin
            ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffd70);
  options_00 = std::vector<QString,_std::allocator<QString>_>::end
                         ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffd70);
  local_130 = (QString *)
              std::
              find<__gnu_cxx::__normal_iterator<QString_const*,std::vector<QString,std::allocator<QString>>>,QString>
                        (in_RDI,in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd70);
  local_138 = (QString *)
              std::vector<QString,_std::allocator<QString>_>::end
                        ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffd70);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                      *)in_stack_fffffffffffffd70,
                     (__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                      *)in_stack_fffffffffffffd68);
  if (bVar1) {
    local_140 = 0xaaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffd68 =
         (QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_const_QString_&> *)
         (in_RSI + 6);
    local_1a0 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70);
    operator+((QString *)in_stack_fffffffffffffd70,(QLatin1String *)in_stack_fffffffffffffd68);
    operator+(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffd68);
    QFileInfo::QFileInfo((QFileInfo *)&local_140,(QString *)local_158);
    QString::~QString((QString *)0x11e13a);
    local_1a8 = 0xaaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffd70 = (QStringBuilder<const_QString_&,_QLatin1String> *)(in_RSI + 6);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd78,(size_t)in_stack_fffffffffffffd70);
    operator+((QString *)in_stack_fffffffffffffd70,(QLatin1String *)in_stack_fffffffffffffd68);
    QStringBuilder::operator_cast_to_QString(&in_stack_fffffffffffffd68->a);
    QFileInfo::QFileInfo((QFileInfo *)&local_1a8,(QString *)local_1c0);
    QString::~QString((QString *)0x11e1cb);
    QFileInfo::absolutePath();
    findFilesRecursively((Options *)options_00._M_current,info_00,in_RDI._M_current);
    QList<QtDependency>::append(in_stack_fffffffffffffd80,in_RSI);
    QList<QtDependency>::~QList((QList<QtDependency> *)0x11e22e);
    QString::~QString((QString *)0x11e23b);
    QFileInfo::~QFileInfo((QFileInfo *)&local_1a8);
    QFileInfo::~QFileInfo((QFileInfo *)&local_140);
  }
  QList<QtDependency>::QList
            ((QList<QtDependency> *)in_stack_fffffffffffffd70,
             (QList<QtDependency> *)in_stack_fffffffffffffd68);
LAB_0011e26f:
  QList<QtDependency>::~QList((QList<QtDependency> *)0x11e27c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QtDependency> *)info_00;
}

Assistant:

QList<QtDependency> findFilesRecursively(const Options &options, const QString &fileName)
{
    // We try to find the fileName in extraPrefixDirs first. The function behaves differently
    // depending on what the fileName points to. If fileName is a file then we try to find the
    // first occurrence in extraPrefixDirs and return this file. If fileName is directory function
    // iterates over it and looks for deployment artifacts in each 'extraPrefixDirs' entry.
    // Also we assume that if the fileName is recognized as a directory once it will be directory
    // for every 'extraPrefixDirs' entry.
    QList<QtDependency> deps;
    for (const auto &prefix : options.extraPrefixDirs) {
        QFileInfo info(prefix + u'/' + fileName);
        if (info.exists()) {
            if (info.isDir())
                deps.append(findFilesRecursively(options, info, prefix + u'/'));
            else
                return findFilesRecursively(options, info, prefix + u'/');
        }
    }

    // Usually android deployment settings contain Qt install directory in extraPrefixDirs.
    if (std::find(options.extraPrefixDirs.begin(), options.extraPrefixDirs.end(),
                  options.qtInstallDirectory) == options.extraPrefixDirs.end()) {
        QFileInfo info(options.qtInstallDirectory + "/"_L1 + fileName);
        QFileInfo rootPath(options.qtInstallDirectory + "/"_L1);
        deps.append(findFilesRecursively(options, info, rootPath.absolutePath()));
    }
    return deps;
}